

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_433923::NesMmuTest_controller_2_Test::TestBody
          (NesMmuTest_controller_2_Test *this)

{
  StrictMock<n_e_s::core::test::MockNesController> *this_00;
  bool bVar1;
  IMmu *pIVar2;
  int iVar3;
  TypedExpectation<bool_(n_e_s::core::INesController::Button)> *pTVar4;
  ActionInterface<bool_(n_e_s::core::INesController::Button)> *pAVar5;
  _func_int *p_Var6;
  AssertionResult gtest_ar;
  _Any_data local_90;
  code *local_80;
  MatcherBase<n_e_s::core::INesController::Button> local_70;
  undefined1 local_58 [8];
  MatcherBase<n_e_s::core::INesController::Button> local_50;
  bool *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = &(this->super_NesMmuTest).controller2;
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,A);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xb4,"controller2","get(INesController::Button::A)");
  local_38 = (bool *)operator_new(1);
  *local_38 = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x40;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x40","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xb6,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,B);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xb7,"controller2","get(INesController::Button::B)");
  local_38 = (bool *)operator_new(1);
  *local_38 = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x40;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x40","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xb9,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Select);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xba,"controller2","get(INesController::Button::Select)");
  local_38 = (bool *)operator_new(1);
  *local_38 = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x40;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x40","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xbc,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Start);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xbd,"controller2","get(INesController::Button::Start)");
  local_38 = (bool *)operator_new(1);
  *local_38 = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x40;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x40","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xbf,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Up);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc0,"controller2","get(INesController::Button::Up)");
  local_38 = (bool *)operator_new(1);
  *local_38 = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x40;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x40","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xc2,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Down);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc3,"controller2","get(INesController::Button::Down)");
  local_38 = (bool *)operator_new(1);
  *local_38 = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x40;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x40","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xc5,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Left);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc6,"controller2","get(INesController::Button::Left)");
  local_38 = (bool *)operator_new(1);
  *local_38 = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x40;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x40","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,200,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Right);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc9,"controller2","get(INesController::Button::Right)");
  local_38 = (bool *)operator_new(1);
  *local_38 = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x40;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x40","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xcb,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xcc,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xcd,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IMmu[4])(pIVar2,0x4016,1);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,A);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xd3,"controller2","get(INesController::Button::A)");
  local_38 = (bool *)operator_new(1);
  *local_38 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xd5,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,A);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xd6,"controller2","get(INesController::Button::A)");
  local_38 = (bool *)operator_new(1);
  *local_38 = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x40;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x40","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xd8,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IMmu[4])(pIVar2,0x4016,0);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,A);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xdd,"controller2","get(INesController::Button::A)");
  local_38 = (bool *)operator_new(1);
  *local_38 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xdf,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,B);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe0,"controller2","get(INesController::Button::B)");
  local_38 = (bool *)operator_new(1);
  *local_38 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xe2,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Select);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe3,"controller2","get(INesController::Button::Select)");
  local_38 = (bool *)operator_new(1);
  *local_38 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xe5,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Start);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe6,"controller2","get(INesController::Button::Start)");
  local_38 = (bool *)operator_new(1);
  *local_38 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xe8,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Up);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe9,"controller2","get(INesController::Button::Up)");
  local_38 = (bool *)operator_new(1);
  *local_38 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xeb,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Down);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xec,"controller2","get(INesController::Button::Down)");
  local_38 = (bool *)operator_new(1);
  *local_38 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xee,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Left);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xef,"controller2","get(INesController::Button::Left)");
  local_38 = (bool *)operator_new(1);
  *local_38 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf1,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_70,Right);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xf2,"controller2","get(INesController::Button::Right)");
  local_38 = (bool *)operator_new(1);
  *local_38 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_30,local_38);
  pAVar5 = (ActionInterface<bool_(n_e_s::core::INesController::Button)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae300;
  bVar1 = *local_38;
  *(bool *)&pAVar5[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(n_e_s::core::INesController::Button)>::Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)&local_90,pAVar5);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,(Action<bool_(n_e_s::core::INesController::Button)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)
             &((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_70);
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf4,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf5,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  local_90._0_4_ = 0x41;
  pIVar2 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,0x4017);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar3
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_58,"0x41","mmu->read_byte(0x4017)",(int *)local_90._M_pod_data,
             (uchar *)&local_70);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      p_Var6 = (_func_int *)0x247c3a;
    }
    else {
      p_Var6 = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf6,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<bool_(n_e_s::core::INesController::Button)> *)local_58)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(NesMmuTest, controller_2) {
    // No button pressed, extra reads at end to make sure controller is not read
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::B))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Select))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Start))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Up))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Down))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Left))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Right))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));

    // Latch controller button states by toggling strobe (0x4016, bit 0), now
    // new controller read is possible (while stope is high, button A's state
    // should be returned on read)
    mmu->write_byte(0x4016, 0x01);
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    mmu->write_byte(0x4016, 0x00);

    // All buttons pressed, extra reads at end to make sure controller is not
    // read
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::B))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Select))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Start))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Up))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Down))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Left))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Right))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
}